

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyword.cpp
# Opt level: O1

string * __thiscall
ninx::lexer::token::Keyword::dump_abi_cxx11_(string *__return_storage_ptr__,Keyword *this)

{
  ostream *poVar1;
  stringstream s;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"KEYWORD ( type ",0xf);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->type);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," late:",6);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ): \'",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->keyword)._M_dataplus._M_p,(this->keyword)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Keyword::dump() const {
    std::stringstream s;
    s << "KEYWORD ( type " << static_cast<int>(this-> type) << " late:" << this->late << " ): '" << this->keyword << "'";
    return s.str();
}